

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_file_type(char *fname)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_48 [8];
  htsFormat fmt;
  hFILE *f;
  int len;
  char *fname_local;
  
  sVar3 = strlen(fname);
  iVar2 = (int)sVar3;
  iVar1 = strcasecmp(".vcf.gz",fname + (long)iVar2 + -7);
  if (iVar1 == 0) {
    fname_local._4_4_ = 3;
  }
  else {
    iVar1 = strcasecmp(".vcf",fname + (long)iVar2 + -4);
    if (iVar1 == 0) {
      fname_local._4_4_ = 2;
    }
    else {
      iVar2 = strcasecmp(".bcf",fname + (long)iVar2 + -4);
      if (iVar2 == 0) {
        fname_local._4_4_ = 5;
      }
      else {
        iVar2 = strcmp("-",fname);
        if (iVar2 == 0) {
          fname_local._4_4_ = 8;
        }
        else {
          fmt.specific = hopen(fname,"r");
          if ((hFILE *)fmt.specific == (hFILE *)0x0) {
            fname_local._4_4_ = 0;
          }
          else {
            iVar2 = hts_detect_format((hFILE *)fmt.specific,(htsFormat *)local_48);
            if (iVar2 < 0) {
              hclose_abruptly((hFILE *)fmt.specific);
              fname_local._4_4_ = 0;
            }
            else {
              iVar2 = hclose((hFILE *)fmt.specific);
              if (iVar2 < 0) {
                fname_local._4_4_ = 0;
              }
              else if (local_48._4_4_ == vcf) {
                fname_local._4_4_ = 3;
                if (fmt.format == unknown_format) {
                  fname_local._4_4_ = 2;
                }
              }
              else if (local_48._4_4_ == bcf) {
                fname_local._4_4_ = 5;
                if (fmt.format == unknown_format) {
                  fname_local._4_4_ = 4;
                }
              }
              else {
                fname_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return fname_local._4_4_;
}

Assistant:

int hts_file_type(const char *fname)
{
    int len = strlen(fname);
    if ( !strcasecmp(".vcf.gz",fname+len-7) ) return FT_VCF_GZ;
    if ( !strcasecmp(".vcf",fname+len-4) ) return FT_VCF;
    if ( !strcasecmp(".bcf",fname+len-4) ) return FT_BCF_GZ;
    if ( !strcmp("-",fname) ) return FT_STDIN;

    hFILE *f = hopen(fname, "r");
    if (f == NULL) return 0;

    htsFormat fmt;
    if (hts_detect_format(f, &fmt) < 0) { hclose_abruptly(f); return 0; }
    if (hclose(f) < 0) return 0;

    switch (fmt.format) {
    case vcf: return (fmt.compression == no_compression)? FT_VCF : FT_VCF_GZ;
    case bcf: return (fmt.compression == no_compression)? FT_BCF : FT_BCF_GZ;
    default:  return 0;
    }
}